

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_websocket.c
# Opt level: O0

void test_send_multiple_jobs_with_failures(void)

{
  cio_websocket *websocket;
  _Bool _Var1;
  cio_error cVar2;
  size_t frame_length;
  undefined1 local_128 [4];
  cio_error err;
  cio_write_buffer wb;
  cio_write_buffer text_wbh;
  cio_write_buffer pong_wbh;
  cio_write_buffer ping_wbh;
  write_func write_funcs [3];
  undefined1 local_88 [8];
  char buffer [125];
  
  memset(local_88,0,0x7d);
  local_88[0] = 0x61;
  ping_wbh.data.element.length = (size_t)bs_write_later;
  cio_buffered_stream_write_fake.custom_fake_seq =
       (_func_cio_error_cio_buffered_stream_ptr_cio_write_buffer_ptr_cio_buffered_stream_write_handler_t_void_ptr
        **)&ping_wbh.data.element.length;
  cio_buffered_stream_write_fake.custom_fake_seq_len = 3;
  cio_write_buffer_head_init((cio_write_buffer *)((long)&pong_wbh.data + 8));
  cio_write_buffer_head_init((cio_write_buffer *)((long)&text_wbh.data + 8));
  cio_write_buffer_head_init((cio_write_buffer *)((long)&wb.data + 8));
  cio_write_buffer_element_init((cio_write_buffer *)local_128,local_88,0x7d);
  cio_write_buffer_queue_tail
            ((cio_write_buffer *)((long)&wb.data + 8),(cio_write_buffer *)local_128);
  cVar2 = cio_websocket_write_ping
                    (ws,(cio_write_buffer *)((long)&pong_wbh.data + 8),write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a ping frame did not succeed!",0x3a8,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_write_pong
                    (ws,(cio_write_buffer *)((long)&text_wbh.data + 8),write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a pong frame did not succeed!",0x3aa,UNITY_DISPLAY_STYLE_INT);
  websocket = ws;
  frame_length = cio_write_buffer_get_total_size((cio_write_buffer *)((long)&wb.data + 8));
  cVar2 = cio_websocket_write_message_first_chunk
                    (websocket,frame_length,(cio_write_buffer *)((long)&wb.data + 8),true,false,
                     write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a text frame did not succeed!",0x3ac,UNITY_DISPLAY_STYLE_INT);
  cVar2 = cio_websocket_close(ws,CIO_WEBSOCKET_CLOSE_NORMAL,(char *)0x0,write_handler,(void *)0x0);
  UnityAssertEqualNumber
            (0,(long)cVar2,"Writing a close frame did not succeed!",0x3ae,UNITY_DISPLAY_STYLE_INT);
  cio_buffered_stream_write_fake.custom_fake = bs_write_error;
  bs_write_ok(write_later_bs,write_later_buf,write_later_handler,write_later_handler_context);
  UnityAssertEqualNumber
            (4,(ulong)write_handler_fake.call_count,"Write handler was not called",0x3b4,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[0],
             "websocket parameter of write_handler not correct",0x3b5,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[0] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3b6);
  }
  UnityAssertEqualNumber
            (0,(long)write_handler_fake.arg2_history[0],"err parameter of write_handler not correct"
             ,0x3b7,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[1],
             "websocket parameter of write_handler not correct",0x3b8,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[1] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3b9);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[1],
             "err parameter of write_handler not correct",0x3ba,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[2],
             "websocket parameter of write_handler not correct",0x3bb,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[2] != (void *)0x0) {
    UnityFail("context parameter of write_handler not NULL",0x3bc);
  }
  UnityAssertEqualNumber
            (-0x7d,(long)write_handler_fake.arg2_history[2],
             "err parameter of write_handler not correct",0x3bd,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            ((UNITY_INT)ws,(UNITY_INT)write_handler_fake.arg0_history[3],
             "websocket parameter of write_handler not correct",0x3be,UNITY_DISPLAY_STYLE_INT);
  if (write_handler_fake.arg1_history[3] == (void *)0x0) {
    UnityAssertEqualNumber
              (-0x7d,(long)write_handler_fake.arg2_history[3],
               "err parameter of write_handler not correct",0x3c0,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)on_error_fake.call_count,"error callback was called",0x3c2,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((UNITY_INT)ws,(UNITY_INT)on_error_fake.arg0_val,
               "ws parameter in first fragment of error callback not correct",0x3c3,
               UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (-0x5a,(long)on_error_fake.arg1_val,"error parameter in error callback not correct",
               0x3c4,UNITY_DISPLAY_STYLE_INT);
    _Var1 = check_frame(CIO_WEBSOCKET_PING_FRAME,(char *)0x0,0,true);
    if (!_Var1) {
      UnityFail("Written ping frame not correct",0x3c6);
    }
    _Var1 = is_close_frame(0x3f3,true);
    if (!_Var1) {
      UnityFail("Written close frame not correct",0x3c7);
    }
    return;
  }
  UnityFail("context parameter of write_handler not NULL",0x3bf);
}

Assistant:

static void test_send_multiple_jobs_with_failures(void)
{
	char buffer[125] = {'a'};

	typedef enum cio_error (*write_func)(struct cio_buffered_stream *buffered_stream, struct cio_write_buffer *buffer, cio_buffered_stream_write_handler_t handler, void *handler_context);
	write_func write_funcs[3] = {bs_write_later, bs_write_error, bs_write_ok};

	cio_buffered_stream_write_fake.custom_fake_seq = write_funcs;
	cio_buffered_stream_write_fake.custom_fake_seq_len = ARRAY_SIZE(write_funcs);

	struct cio_write_buffer ping_wbh;
	cio_write_buffer_head_init(&ping_wbh);
	struct cio_write_buffer pong_wbh;
	cio_write_buffer_head_init(&pong_wbh);
	struct cio_write_buffer text_wbh;
	cio_write_buffer_head_init(&text_wbh);

	struct cio_write_buffer wb;
	cio_write_buffer_element_init(&wb, buffer, sizeof(buffer));
	cio_write_buffer_queue_tail(&text_wbh, &wb);

	enum cio_error err = cio_websocket_write_ping(ws, &ping_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a ping frame did not succeed!");
	err = cio_websocket_write_pong(ws, &pong_wbh, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a pong frame did not succeed!");
	err = cio_websocket_write_message_first_chunk(ws, cio_write_buffer_get_total_size(&text_wbh), &text_wbh, true, false, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a text frame did not succeed!");
	err = cio_websocket_close(ws, CIO_WEBSOCKET_CLOSE_NORMAL, NULL, write_handler, NULL);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Writing a close frame did not succeed!");

	// Simulate write call over the eventloop
	cio_buffered_stream_write_fake.custom_fake = bs_write_error;
	bs_write_ok(write_later_bs, write_later_buf, write_later_handler, write_later_handler_context);

	TEST_ASSERT_EQUAL_MESSAGE(4, write_handler_fake.call_count, "Write handler was not called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[0], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[0], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, write_handler_fake.arg2_history[0], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[1], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[1], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[1], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[2], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[2], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[2], "err parameter of write_handler not correct");
	TEST_ASSERT_EQUAL_MESSAGE(ws, write_handler_fake.arg0_history[3], "websocket parameter of write_handler not correct");
	TEST_ASSERT_NULL_MESSAGE(write_handler_fake.arg1_history[3], "context parameter of write_handler not NULL");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_OPERATION_ABORTED, write_handler_fake.arg2_history[3], "err parameter of write_handler not correct");

	TEST_ASSERT_EQUAL_MESSAGE(1, on_error_fake.call_count, "error callback was called");
	TEST_ASSERT_EQUAL_MESSAGE(ws, on_error_fake.arg0_val, "ws parameter in first fragment of error callback not correct");
	TEST_ASSERT_EQUAL_MESSAGE(CIO_MESSAGE_TOO_LONG, on_error_fake.arg1_val, "error parameter in error callback not correct");

	TEST_ASSERT_TRUE_MESSAGE(check_frame(CIO_WEBSOCKET_PING_FRAME, NULL, 0, true), "Written ping frame not correct");
	TEST_ASSERT_TRUE_MESSAGE(is_close_frame(CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, true), "Written close frame not correct");
}